

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
::rehash(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
         *this,size_t n)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  Layout LVar5;
  
  if (n != 0 || this->capacity_ != 0) {
    uVar1 = this->size_;
    if (n == 0 && uVar1 == 0) {
      sVar2 = this->capacity_;
      if (sVar2 != 0) {
        lVar4 = 8;
        for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
          if (-1 < this->ctrl_[sVar3]) {
            NonStandardLayout::~NonStandardLayout((NonStandardLayout *)((long)this->slots_ + lVar4))
            ;
          }
          lVar4 = lVar4 + 0x30;
        }
        LVar5 = MakeLayout(this->capacity_);
        Deallocate<8ul,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
                  ((Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *)&this->settings_,
                   this->ctrl_,
                   LVar5.
                   super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<int,_phmap::priv::NonStandardLayout>_>
                   .size_[1] * 0x30 +
                   (LVar5.
                    super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<int,_phmap::priv::NonStandardLayout>_>
                    .size_[0] + 7 & 0xfffffffffffffff8));
        (this->settings_).
        super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
        .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
        this->ctrl_ = (ctrl_t *)0x0;
        this->slots_ = (slot_type *)0x0;
        this->size_ = 0;
        this->capacity_ = 0;
      }
      return;
    }
    if (uVar1 <= n) {
      uVar1 = n;
    }
    lVar4 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    sVar2 = 1;
    if (uVar1 != 0) {
      sVar2 = 0xffffffffffffffff >> (~(byte)lVar4 & 0x3f);
    }
    if ((n == 0) || (this->capacity_ < sVar2)) {
      resize(this,sVar2);
      return;
    }
  }
  return;
}

Assistant:

void rehash(size_t n) {
        if (n == 0 && capacity_ == 0) return;
        if (n == 0 && size_ == 0) {
            destroy_slots();
            infoz_.RecordStorageChanged(0, 0);
            return;
        }
        // bitor is a faster way of doing `max` here. We will round up to the next
        // power-of-2-minus-1, so bitor is good enough.
        auto m = NormalizeCapacity((std::max)(n, size()));
        // n == 0 unconditionally rehashes as per the standard.
        if (n == 0 || m > capacity_) {
            resize(m);
        }
    }